

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_4> *
tcu::operator*(Matrix<float,_4,_4> *__return_storage_ptr__,Matrix<float,_4,_3> *a,
              Matrix<float,_3,_4> *b)

{
  Vector<float,_4> *pVVar1;
  int row_1;
  long lVar2;
  Matrix<float,_4,_4> *res;
  float *pfVar3;
  int row;
  long lVar4;
  Vector<float,_3> *pVVar5;
  long lVar6;
  float v;
  float fVar7;
  undefined4 uVar8;
  
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[3].m_data[2] = 0.0;
  pVVar1[3].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar2 = 0;
  lVar4 = 0;
  pfVar3 = (float *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar2 != lVar6) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar6) = uVar8;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
    lVar2 = lVar2 + 0x10;
  } while (lVar4 != 4);
  lVar2 = 0;
  do {
    lVar4 = 0;
    pVVar5 = (Vector<float,_3> *)b;
    do {
      fVar7 = 0.0;
      lVar6 = 0;
      do {
        fVar7 = fVar7 + *(float *)((long)a + lVar6 * 4) *
                        *(float *)((long)((Vector<tcu::Vector<float,_3>,_4> *)pVVar5->m_data)->
                                         m_data[0].m_data + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      (__return_storage_ptr__->m_data).m_data[lVar4].m_data[lVar2] = fVar7;
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar4 != 4);
    lVar2 = lVar2 + 1;
    a = (Matrix<float,_4,_3> *)((long)a + 4);
  } while (lVar2 != 4);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}